

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O1

void aom_highbd_v_predictor_4x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  int iVar2;
  
  uVar1 = *(undefined8 *)above;
  iVar2 = 1;
  do {
    *(undefined8 *)dst = uVar1;
    *(undefined8 *)(dst + stride) = uVar1;
    *(undefined8 *)(dst + stride * 2) = uVar1;
    *(undefined8 *)(dst + stride * 3) = uVar1;
    dst = dst + stride * 4;
    iVar2 = iVar2 + -1;
  } while (iVar2 == 0);
  return;
}

Assistant:

void aom_highbd_v_predictor_4x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                     const uint16_t *above,
                                     const uint16_t *left, int bd) {
  (void)left;
  (void)bd;
  const __m128i above_u16 = _mm_loadl_epi64((const __m128i *)above);
  int i;
  for (i = 0; i < 2; ++i) {
    _mm_storel_epi64((__m128i *)dst, above_u16);
    _mm_storel_epi64((__m128i *)(dst + stride), above_u16);
    _mm_storel_epi64((__m128i *)(dst + 2 * stride), above_u16);
    _mm_storel_epi64((__m128i *)(dst + 3 * stride), above_u16);
    dst += stride << 2;
  }
}